

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O3

void rw::V3d::transformPoints(V3d *out,V3d *in,int32 n,Matrix *m)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  long lVar16;
  
  if (0 < n) {
    lVar16 = 0;
    do {
      fVar1 = *(float *)((long)&in->x + lVar16);
      fVar2 = *(float *)((long)&in->y + lVar16);
      fVar3 = *(float *)((long)&in->z + lVar16);
      fVar4 = (float)(m->up).z;
      fVar5 = (float)(m->right).z;
      fVar6 = (float)(m->at).z;
      fVar7 = (float)(m->pos).z;
      uVar8 = (m->right).x;
      uVar12 = (m->right).y;
      uVar9 = (m->up).x;
      uVar13 = (m->up).y;
      uVar10 = (m->at).x;
      uVar14 = (m->at).y;
      uVar11 = (m->pos).x;
      uVar15 = (m->pos).y;
      *(ulong *)((long)&out->x + lVar16) =
           CONCAT44(fVar3 * (float)uVar14 + fVar1 * (float)uVar12 + (float)uVar13 * fVar2 +
                    (float)uVar15,
                    fVar3 * (float)uVar10 + fVar1 * (float)uVar8 + (float)uVar9 * fVar2 +
                    (float)uVar11);
      *(float *)((long)&out->z + lVar16) = fVar6 * fVar3 + fVar5 * fVar1 + fVar4 * fVar2 + fVar7;
      lVar16 = lVar16 + 0xc;
    } while ((ulong)(uint)n * 0xc != lVar16);
  }
  return;
}

Assistant:

void
V3d::transformPoints(V3d *out, const V3d *in, int32 n, const Matrix *m)
{
	int32 i;
	V3d tmp;
	for(i = 0; i < n; i++){
		tmp.x = in[i].x*m->right.x + in[i].y*m->up.x + in[i].z*m->at.x + m->pos.x;
		tmp.y = in[i].x*m->right.y + in[i].y*m->up.y + in[i].z*m->at.y + m->pos.y;
		tmp.z = in[i].x*m->right.z + in[i].y*m->up.z + in[i].z*m->at.z + m->pos.z;
		out[i] = tmp;
	}
}